

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::setAutoRepeat(QAction *this,bool on)

{
  byte bVar1;
  QActionPrivate *pQVar2;
  QCoreApplication *pQVar3;
  byte in_SIL;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QActionPrivate *d;
  QShortcutMap *in_stack_00000078;
  QActionPrivate *in_stack_00000080;
  char *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  pQVar2 = d_func((QAction *)0x97594e);
  if ((pQVar2->field_0x174 & 1) != (bVar1 & 1)) {
    pQVar3 = QCoreApplication::instance();
    if (pQVar3 == (QCoreApplication *)0x0) {
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffc8),
                 (int)((ulong)pQVar2 >> 0x20),in_stack_ffffffffffffffb8);
      QMessageLogger::warning
                (local_28,"QAction: Initialize Q(Gui)Application before calling \'setAutoRepeat\'.")
      ;
    }
    else {
      pQVar2->field_0x174 = pQVar2->field_0x174 & 0xfe | bVar1 & 1;
      QGuiApplicationPrivate::instance();
      QActionPrivate::redoGrab(in_stack_00000080,in_stack_00000078);
      QActionPrivate::sendDataChanged((QActionPrivate *)CONCAT17(bVar1,in_stack_ffffffffffffffc8));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAction::setAutoRepeat(bool on)
{
    Q_D(QAction);
    if (d->autorepeat == on)
        return;
    QAPP_CHECK("setAutoRepeat");
    d->autorepeat = on;
    d->redoGrab(QGuiApplicationPrivate::instance()->shortcutMap);
    d->sendDataChanged();
}